

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O1

worker_t * __thiscall acto::core::runtime_t::create_worker(runtime_t *this)

{
  workers_t *pwVar1;
  __int_type_conflict _Var2;
  worker_t *this_00;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  this_00 = (worker_t *)operator_new(0x98);
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/artpaul[P]acto/src/runtime.cpp:366:30)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/artpaul[P]acto/src/runtime.cpp:366:30)>
             ::_M_manager;
  worker_t::worker_t(this_00,&this->super_callbacks,(function<void_()> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)((_Any_data *)&local_38,(_Any_data *)&local_38,__destroy_functor);
  }
  LOCK();
  pwVar1 = &this->workers_;
  _Var2 = (pwVar1->count).super___atomic_base<unsigned_long>._M_i;
  (pwVar1->count).super___atomic_base<unsigned_long>._M_i =
       (pwVar1->count).super___atomic_base<unsigned_long>._M_i + 1;
  UNLOCK();
  if (_Var2 == 0) {
    event::reset(&this->no_workers_event_);
  }
  return this_00;
}

Assistant:

worker_t* runtime_t::create_worker() {
  worker_t* const result =
    new core::worker_t(this, [] { thread_context.is_worker_thread = true; });

  if (++workers_.count == 1) {
    no_workers_event_.reset();
  }

  return result;
}